

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void logical_or_combine_accum_help(int x,int *accum)

{
  bool local_19;
  int *accum_local;
  int x_local;
  
  if (x != 0x7ffffffe) {
    if (x == 0x7fffffff) {
      if (*accum == 0x7ffffffe) {
        *accum = 0x7fffffff;
      }
    }
    else if ((*accum == 0x7fffffff) || (*accum == 0x7ffffffe)) {
      *accum = (uint)(x != 0);
    }
    else {
      local_19 = *accum != 0 || x != 0;
      *accum = (uint)local_19;
    }
  }
  return;
}

Assistant:

static void logical_or_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = (x != 0);
	} else {
		*accum = *accum || (x != 0);
	}
}